

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

reference __thiscall
absl::lts_20250127::container_internal::
btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
::operator*(btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
            *this)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  reference pvVar4;
  anon_class_1_0_00000001 local_14;
  anon_class_1_0_00000001 local_13;
  anon_class_1_0_00000001 local_12;
  anon_class_1_0_00000001 local_11;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
  *local_10;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
  *this_local;
  
  local_10 = this;
  if (this->node_ ==
      (btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
       *)0x0) {
    operator*::anon_class_1_0_00000001::operator()(&local_11);
  }
  btree_iterator_generation_info_disabled::assert_valid_generation(this->node_);
  iVar1 = this->position_;
  bVar2 = btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
          ::start(this->node_);
  if (iVar1 < (int)(uint)bVar2) {
    operator*::anon_class_1_0_00000001::operator()(&local_12);
  }
  iVar1 = this->position_;
  bVar2 = btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
          ::finish(this->node_);
  if ((int)(uint)bVar2 <= iVar1) {
    bVar3 = IsEndIterator(this);
    if (bVar3) {
      operator*::anon_class_1_0_00000001::operator()(&local_13);
    }
    iVar1 = this->position_;
    bVar2 = btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
            ::finish(this->node_);
    if ((int)(uint)bVar2 <= iVar1) {
      operator*::anon_class_1_0_00000001::operator()(&local_14);
    }
  }
  pvVar4 = btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
           ::value(this->node_,(ulong)(this->position_ & 0xff));
  return pvVar4;
}

Assistant:

reference operator*() const {
    ABSL_HARDENING_ASSERT(node_ != nullptr);
    assert_valid_generation(node_);
    ABSL_HARDENING_ASSERT(position_ >= node_->start());
    if (position_ >= node_->finish()) {
      ABSL_HARDENING_ASSERT(!IsEndIterator() && "Dereferencing end() iterator");
      ABSL_HARDENING_ASSERT(position_ < node_->finish());
    }
    return node_->value(static_cast<field_type>(position_));
  }